

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonblock_test.c
# Opt level: O1

void reqthr(void *arg)

{
  nng_socket sid;
  int iVar1;
  undefined4 local_1c [2];
  int query;
  
  sid.id = *arg;
  nng_dial(sid,addr,(nng_dialer *)0x0,2);
  local_1c[0] = 0;
  iVar1 = nng_send(sid,local_1c,4,0);
  if (iVar1 != 7) {
    do {
      nng_msleep(0x32);
      iVar1 = nng_send(sid,local_1c,4,0);
    } while (iVar1 != 7);
  }
  return;
}

Assistant:

void
reqthr(void *arg)
{
	nng_socket req = *(nng_socket *) arg;

	nng_dial(req, addr, NULL, NNG_FLAG_NONBLOCK);

	int query = 0;
	// We just keep pounding out requests, no wait for response.
	for (;;) {
		int rv;
		rv = nng_send(req, &query, sizeof(query), 0);
		if (rv == NNG_ECLOSED) {
			return;
		}
		nng_msleep(50);
	}
}